

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O0

bool __thiscall
ConsistencyChecker::checkConstructorSection
          (ConsistencyChecker *this,Constructor *ct,ConstructTpl *cttpl)

{
  bool bVar1;
  reference ppOVar2;
  __normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_50;
  OpTpl **local_48;
  byte local_39;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvStack_38;
  bool testresult;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *ops;
  const_iterator iter;
  ConstructTpl *cttpl_local;
  Constructor *ct_local;
  ConsistencyChecker *this_local;
  
  if (cttpl == (ConstructTpl *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    iter._M_current = (OpTpl **)cttpl;
    __gnu_cxx::__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
    __normal_iterator((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                       *)&ops);
    pvStack_38 = ConstructTpl::getOpvec((ConstructTpl *)iter._M_current);
    local_39 = 1;
    local_48 = (OpTpl **)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::begin(pvStack_38);
    ops = (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)local_48;
    while( true ) {
      local_50._M_current =
           (OpTpl **)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end(pvStack_38);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                          *)&ops,&local_50);
      if (!bVar1) break;
      ppOVar2 = __gnu_cxx::
                __normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
                operator*((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                           *)&ops);
      bVar1 = sizeRestriction(this,*ppOVar2,ct);
      if (!bVar1) {
        local_39 = 0;
      }
      ppOVar2 = __gnu_cxx::
                __normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
                operator*((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                           *)&ops);
      bVar1 = checkOpMisuse(this,*ppOVar2,ct);
      if (!bVar1) {
        local_39 = 0;
      }
      __gnu_cxx::__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
      ::operator++((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                    *)&ops);
    }
    this_local._7_1_ = (bool)(local_39 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ConsistencyChecker::checkConstructorSection(Constructor *ct,ConstructTpl *cttpl)

{ // Check all the OpTpl s within the given section for consistency, return true if all tests pass
  if (cttpl == (ConstructTpl *)0)
    return true;		// Nothing to check
  vector<OpTpl *>::const_iterator iter;
  const vector<OpTpl *> &ops(cttpl->getOpvec());
  bool testresult = true;

  for(iter=ops.begin();iter!=ops.end();++iter) {
    if (!sizeRestriction(*iter,ct))
      testresult = false;
    if (!checkOpMisuse(*iter,ct))
      testresult = false;
  }
  return testresult;
}